

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall
S2Polygon::InitToSimplifiedInCell
          (S2Polygon *this,S2Polygon *a,S2Cell *cell,S1Angle snap_radius,S1Angle boundary_tolerance)

{
  bool bVar1;
  ostream *os;
  unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_> *polyline;
  pointer puVar2;
  double dVar3;
  _Head_base<0UL,_S2Builder::Layer_*,_false> local_2b0;
  Options local_2a8;
  S2Error error;
  vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  polylines;
  S2LogMessage local_258;
  S2Builder builder;
  
  SimplifyEdgesInCell(&polylines,a,cell,boundary_tolerance.radians_ * 2.449489742783178,snap_radius)
  ;
  s2builderutil::IdentitySnapFunction::IdentitySnapFunction
            ((IdentitySnapFunction *)&builder,(S1Angle)0x3cd0000000000000);
  S2Builder::Options::Options(&local_2a8,(SnapFunction *)&builder);
  local_2a8.idempotent_ = false;
  S2Builder::S2Builder(&builder,&local_2a8);
  local_258._0_8_ = this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>
            ((absl *)&error,(S2Polygon **)&local_258);
  local_2b0._M_head_impl = (Layer *)error._0_8_;
  error.code_ = OK;
  error._4_4_ = 0;
  S2Builder::StartLayer
            (&builder,(unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)
                      &local_2b0);
  if (local_2b0._M_head_impl != (Layer *)0x0) {
    (*(local_2b0._M_head_impl)->_vptr_Layer[1])();
  }
  local_2b0._M_head_impl = (Layer *)0x0;
  if (error._0_8_ != 0) {
    (**(code **)(*(long *)error._0_8_ + 8))();
  }
  for (puVar2 = polylines.
                super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 != polylines.
                super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    S2Builder::AddPolyline
              (&builder,(puVar2->_M_t).
                        super___uniq_ptr_impl<S2Polyline,_std::default_delete<S2Polyline>_>._M_t.
                        super__Tuple_impl<0UL,_S2Polyline_*,_std::default_delete<S2Polyline>_>.
                        super__Head_base<0UL,_S2Polyline_*,_false>._M_head_impl);
  }
  error._0_8_ = error._0_8_ & 0xffffffff00000000;
  error.text_._M_dataplus._M_p = (pointer)&error.text_.field_2;
  error.text_._M_string_length = 0;
  error.text_.field_2._M_local_buf[0] = '\0';
  bVar1 = S2Builder::Build(&builder,&error);
  if (bVar1) {
    if ((int)((ulong)((long)(this->loops_).
                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->loops_).
                           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) {
      dVar3 = S2LatLngRect::Area(&a->bound_);
      if (6.283185307179586 < dVar3) {
        dVar3 = GetArea(a);
        if (6.283185307179586 < dVar3) {
          Invert(this);
        }
      }
    }
    std::__cxx11::string::~string((string *)&error.text_);
    S2Builder::~S2Builder(&builder);
    if ((tuple<S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>)
        local_2a8.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
        (_Head_base<0UL,_S2Builder::SnapFunction_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_2a8.snap_function_._M_t.
          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
    }
    std::
    vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
    ::~vector(&polylines);
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_258,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x44c,kFatal,(ostream *)&std::cerr);
  os = std::operator<<(local_258.stream_,"Could not build polygon: ");
  ::operator<<(os,&error);
  abort();
}

Assistant:

void S2Polygon::InitToSimplifiedInCell(
    const S2Polygon* a, const S2Cell& cell,
    S1Angle snap_radius, S1Angle boundary_tolerance) {
  // The polygon to be simplified consists of "boundary edges" that follow the
  // cell boundary and "interior edges" that do not.  We want to simplify the
  // interior edges while leaving the boundary edges unchanged.  It's not
  // sufficient to call S2Builder::ForceVertex() on all boundary vertices.
  // For example, suppose the polygon includes a triangle ABC where all three
  // vertices are on the cell boundary and B is a cell corner.  Then if
  // interior edge AC snaps to vertex B, this loop would become degenerate and
  // be removed.  Similarly, we don't want boundary edges to snap to interior
  // vertices, since this also would cause portions of the polygon along the
  // boundary to be removed.
  //
  // Instead we use a two-pass algorithm.  In the first pass, we simplify
  // *only* the interior edges, using ForceVertex() to ensure that any edge
  // endpoints on the cell boundary do not move.  In the second pass, we add
  // the boundary edges (which are guaranteed to still form loops with the
  // interior edges) and build the output polygon.
  //
  // Note that in theory, simplifying the interior edges could create an
  // intersection with one of the boundary edges, since if two interior edges
  // intersect very near the boundary then the intersection point could be
  // slightly outside the cell (by at most S2::kIntersectionError).
  // This is the *only* way that a self-intersection can be created, and it is
  // expected to be extremely rare.  Nevertheless we use a small snap radius
  // in the second pass in order to eliminate any such self-intersections.
  //
  // We also want to preserve the cyclic vertex order of loops, so that the
  // original polygon can be reconstructed when no simplification is possible
  // (i.e., idempotency).  In order to do this, we group the input edges into
  // a sequence of polylines.  Each polyline contains only one type of edge
  // (interior or boundary).  We use S2Builder to simplify the interior
  // polylines, while the boundary polylines are passed through unchanged.
  // Each interior polyline is in its own S2Builder layer in order to keep the
  // edges in sequence.  This lets us ensure that in the second pass, the
  // edges are added in their original order so that S2PolygonLayer can
  // reconstruct the original loops.

  // We want an upper bound on how much "u" or "v" can change when a point on
  // the boundary of the S2Cell is moved away by up to "boundary_tolerance".
  // Inverting this, instead we could compute a lower bound on how far a point
  // can move away from an S2Cell edge when "u" or "v" is changed by a given
  // amount.  The latter quantity is simply (S2::kMinWidth.deriv() / 2)
  // under the S2_LINEAR_PROJECTION model, where we divide by 2 because we
  // want the bound in terms of (u = 2 * s - 1) rather than "s" itself.
  // Consulting s2metrics.cc, this value is sqrt(2/3)/2 = sqrt(1/6).
  // Going back to the original problem, this gives:
  double boundary_tolerance_uv = sqrt(6) * boundary_tolerance.radians();

  // The first pass yields a collection of simplified polylines that preserve
  // the original cyclic vertex order.
  auto polylines = SimplifyEdgesInCell(*a, cell, boundary_tolerance_uv,
                                       snap_radius);

  // The second pass eliminates any intersections between interior edges and
  // boundary edges, and then assembles the edges into a polygon.
  S2Builder::Options options(
      (IdentitySnapFunction(S2::kIntersectionError)));
  options.set_idempotent(false);  // Force snapping up to the given radius
  S2Builder builder(options);
  builder.StartLayer(make_unique<S2PolygonLayer>(this));
  for (const auto& polyline : polylines) {
    builder.AddPolyline(*polyline);
  }
  S2Error error;
  if (!builder.Build(&error)) {
    S2_LOG(DFATAL) << "Could not build polygon: " << error;
    return;
  }
  // If there are no loops, check whether the result should be the full
  // polygon rather than the empty one.  (See InitToApproxIntersection.)
  if (num_loops() == 0) {
    if (a->bound_.Area() > 2 * M_PI && a->GetArea() > 2 * M_PI) Invert();
  }
}